

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O1

ssize_t __thiscall
LASwriteItemCompressed_RGB14_v3::write
          (LASwriteItemCompressed_RGB14_v3 *this,int __fd,void *__buf,size_t __n)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  U16 *item;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  ushort uVar9;
  ushort uVar10;
  undefined4 in_register_00000034;
  ushort *puVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  uint local_7c;
  
  puVar11 = (ushort *)CONCAT44(in_register_00000034,__fd);
  item = this->contexts[this->current_context].last_item;
  uVar5 = *__buf;
  if ((this->current_context != uVar5) &&
     (this->current_context = uVar5, this->contexts[uVar5].unused == true)) {
    createAndInitModelsAndCompressors(this,uVar5,(U8 *)item);
    item = this->contexts[this->current_context].last_item;
  }
  uVar19 = *item & 0xff;
  uVar18 = *puVar11 & 0xff;
  uVar4 = *item & 0xff00;
  uVar9 = *puVar11 & 0xff00;
  uVar10 = item[1] & 0xff;
  uVar16 = puVar11[1] & 0xff;
  uVar12 = item[1] & 0xff00;
  uVar15 = puVar11[1] & 0xff00;
  uVar14 = item[2] & 0xff;
  uVar17 = puVar11[2] & 0xff;
  uVar13 = item[2] & 0xff00;
  uVar7 = puVar11[2] & 0xff00;
  uVar5 = (uint)(uVar19 != uVar18) + (uint)(uVar4 != uVar9) * 2 + (uint)(uVar10 != uVar16) * 4 +
          (uint)(uVar12 != uVar15) * 8 | (uint)(uVar14 != uVar17) << 4 |
          (uint)((uVar9 != uVar7 || uVar9 != uVar15) || (uVar18 != uVar17 || uVar18 != uVar16)) << 6
          | (uint)(uVar13 != uVar7) << 5;
  ArithmeticEncoder::encodeSymbol
            (this->enc_RGB,this->contexts[this->current_context].m_byte_used,uVar5);
  local_7c = 0;
  uVar8 = 0;
  if (uVar19 != uVar18) {
    uVar8 = (uint)(byte)*puVar11 - (uint)(byte)*item;
    ArithmeticEncoder::encodeSymbol
              (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_0,
               (uVar8 >> 0x17 & 0x100) + uVar8);
  }
  if (uVar4 != uVar9) {
    local_7c = (uint)*(byte *)((long)puVar11 + 1) - (uint)*(byte *)((long)item + 1);
    ArithmeticEncoder::encodeSymbol
              (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_1,
               (local_7c >> 0x17 & 0x100) + local_7c);
  }
  if ((uVar9 != uVar7 || uVar9 != uVar15) || (uVar18 != uVar17 || uVar18 != uVar16)) {
    if (uVar10 != uVar16) {
      uVar3 = (byte)item[1] + uVar8;
      uVar6 = uVar3 & 0xff;
      if (0xfe < (int)uVar3) {
        uVar6 = 0xff;
      }
      uVar2 = 0;
      if (0 < (int)uVar3) {
        uVar2 = uVar6;
      }
      uVar2 = (byte)puVar11[1] - uVar2;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_2,
                 (uVar2 >> 0x17 & 0x100) + uVar2);
    }
    if (uVar14 != uVar17) {
      uVar6 = (uint)(byte)item[2] + (int)((uVar8 + (byte)puVar11[1]) - (uint)(byte)item[1]) / 2;
      uVar8 = uVar6 & 0xff;
      if (0xfe < (int)uVar6) {
        uVar8 = 0xff;
      }
      uVar3 = 0;
      if (0 < (int)uVar6) {
        uVar3 = uVar8;
      }
      uVar3 = (byte)puVar11[2] - uVar3;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_4,
                 (uVar3 >> 0x17 & 0x100) + uVar3);
    }
    if (uVar12 != uVar15) {
      uVar6 = *(byte *)((long)item + 3) + local_7c;
      uVar8 = uVar6 & 0xff;
      if (0xfe < (int)uVar6) {
        uVar8 = 0xff;
      }
      uVar3 = 0;
      if (0 < (int)uVar6) {
        uVar3 = uVar8;
      }
      uVar3 = *(byte *)((long)puVar11 + 3) - uVar3;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_3,
                 (uVar3 >> 0x17 & 0x100) + uVar3);
    }
    if (uVar13 != uVar7) {
      uVar6 = (uint)*(byte *)((long)item + 5) +
              (int)((local_7c + *(byte *)((long)puVar11 + 3)) - (uint)*(byte *)((long)item + 3)) / 2
      ;
      uVar8 = uVar6 & 0xff;
      if (0xfe < (int)uVar6) {
        uVar8 = 0xff;
      }
      uVar3 = 0;
      if (0 < (int)uVar6) {
        uVar3 = uVar8;
      }
      uVar3 = *(byte *)((long)puVar11 + 5) - uVar3;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_5,
                 (uVar3 >> 0x17 & 0x100) + uVar3);
    }
  }
  if (uVar5 != 0) {
    this->changed_RGB = true;
  }
  item[2] = puVar11[2];
  uVar1 = *(undefined4 *)puVar11;
  *(undefined4 *)item = uVar1;
  return CONCAT71((uint7)(uint3)((uint)uVar1 >> 8),1);
}

Assistant:

inline BOOL LASwriteItemCompressed_RGB14_v3::write(const U8* item, U32& context)
{
  // get last

  U16* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 writer
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndCompressors(current_context, (U8*)last_item);
      last_item = contexts[current_context].last_item;
    }
  }

  // compress

  I32 diff_l = 0;
  I32 diff_h = 0;
  I32 corr;
  U32 sym = ((last_item[0]&0x00FF) != (((const U16*)item)[0]&0x00FF)) << 0;
  sym |= ((last_item[0]&0xFF00) != (((const U16*)item)[0]&0xFF00)) << 1;
  sym |= ((last_item[1]&0x00FF) != (((const U16*)item)[1]&0x00FF)) << 2;
  sym |= ((last_item[1]&0xFF00) != (((const U16*)item)[1]&0xFF00)) << 3;
  sym |= ((last_item[2]&0x00FF) != (((const U16*)item)[2]&0x00FF)) << 4;
  sym |= ((last_item[2]&0xFF00) != (((const U16*)item)[2]&0xFF00)) << 5;
  sym |= (((((const U16*)item)[0]&0x00FF) != (((const U16*)item)[1]&0x00FF)) || ((((const U16*)item)[0]&0x00FF) != (((const U16*)item)[2]&0x00FF)) || ((((const U16*)item)[0]&0xFF00) != (((const U16*)item)[1]&0xFF00)) || ((((const U16*)item)[0]&0xFF00) != (((const U16*)item)[2]&0xFF00))) << 6;
  enc_RGB->encodeSymbol(contexts[current_context].m_byte_used, sym);
  if (sym & (1 << 0))
  {
    diff_l = ((int)(((const U16*)item)[0]&255)) - (last_item[0]&255);
    enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_0, U8_FOLD(diff_l));
  }
  if (sym & (1 << 1))
  {
    diff_h = ((int)(((const U16*)item)[0]>>8)) - (last_item[0]>>8);
    enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_1, U8_FOLD(diff_h));
  }
  if (sym & (1 << 6))
  {
    if (sym & (1 << 2))
    {
      corr = ((int)(((const U16*)item)[1]&255)) - U8_CLAMP(diff_l + (last_item[1]&255));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_2, U8_FOLD(corr));
    }
    if (sym & (1 << 4))
    {
      diff_l = (diff_l + (((const U16*)item)[1]&255) - (last_item[1]&255)) / 2;
      corr = ((int)(((const U16*)item)[2]&255)) - U8_CLAMP(diff_l + (last_item[2]&255));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_4, U8_FOLD(corr));
    }
    if (sym & (1 << 3))
    {
      corr = ((int)(((const U16*)item)[1]>>8)) - U8_CLAMP(diff_h + (last_item[1]>>8));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_3, U8_FOLD(corr));
    }
    if (sym & (1 << 5))
    {
      diff_h = (diff_h + (((const U16*)item)[1]>>8) - (last_item[1]>>8)) / 2;
      corr = ((int)(((const U16*)item)[2]>>8)) - U8_CLAMP(diff_h + (last_item[2]>>8));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_5, U8_FOLD(corr));
    }
  }
  if (sym)
  {
    changed_RGB = TRUE;
  }
  memcpy(last_item, item, 6);

  return TRUE;
}